

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lefreader.cpp
# Opt level: O0

void __thiscall LEFReader::error(LEFReader *this,string *errstr)

{
  ostream *poVar1;
  string *errstr_local;
  LEFReader *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"Line ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_lineNum);
  poVar1 = std::operator<<(poVar1," : ");
  std::operator<<(poVar1,(string *)errstr);
  return;
}

Assistant:

void LEFReader::error(const std::string &errstr)
{
    std::cerr << "Line " << m_lineNum << " : " << errstr; 
}